

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.cpp
# Opt level: O2

void __thiscall ASDCP::JP2K::Accessor::COM::Dump(COM *this,FILE *stream)

{
  string tmp_str;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  if (*this == (COM)0x1) {
    tmp_str._M_dataplus._M_p = (pointer)&tmp_str.field_2;
    tmp_str._M_string_length = 0;
    tmp_str.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&tmp_str,*(ulong *)(this + 8));
    fprintf((FILE *)stream,"COM:%s\n",tmp_str._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&tmp_str);
    return;
  }
  fwrite("COM:\n",5,1,(FILE *)stream);
  Kumu::hexdump(*(uchar **)(this + 8),*(uint *)(this + 0x10),(_IO_FILE *)stream);
  return;
}

Assistant:

void
ASDCP::JP2K::Accessor::COM::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  if ( IsText() )
    {
      std::string tmp_str;
      tmp_str.assign((char*)CommentData(), CommentSize());
      fprintf(stream, "COM:%s\n", tmp_str.c_str());
    }
  else
    {
      fprintf(stream, "COM:\n");
      Kumu::hexdump(CommentData(), CommentSize(), stream);
    }
}